

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

Interpolation __thiscall tinyusdz::GPrim::get_displayColorsInterpolation(GPrim *this)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  value_type *pvVar3;
  Interpolation IVar4;
  allocator local_41;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,"primvars:displayColor",&local_41);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(&this->props,&local_40);
  std::__cxx11::string::_M_dispose();
  IVar4 = Vertex;
  if (sVar2 != 0) {
    std::__cxx11::string::string((string *)&local_40,"primvars:displayColor",&local_41);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(&this->props,&local_40);
    std::__cxx11::string::_M_dispose();
    Attribute::type_name_abi_cxx11_(&local_40,&this_00->_attrib);
    bVar1 = std::operator==(&local_40,"color3f[]");
    std::__cxx11::string::_M_dispose();
    if ((bVar1) && ((this_00->_attrib)._metas.interpolation.has_value_ == true)) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                         (&(this_00->_attrib)._metas.interpolation);
      IVar4 = *pvVar3;
    }
  }
  return IVar4;
}

Assistant:

Interpolation GPrim::get_displayColorsInterpolation() const {
  if (props.count("primvars:displayColor")) {
    const auto &prop = props.at("primvars:displayColor");
    if (prop.get_attribute().type_name() == "color3f[]") {
      if (prop.get_attribute().metas().interpolation) {
        return prop.get_attribute().metas().interpolation.value();
      }
    }
  }

  return Interpolation::Vertex;  // default 'vertex'
}